

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::ResetInlineCaches(FunctionBody *this)

{
  nullptr_t local_18;
  FunctionBody *local_10;
  FunctionBody *this_local;
  
  local_10 = this;
  SetInlineCacheCount(this,0);
  SetRootObjectLoadInlineCacheStart(this,0);
  SetRootObjectStoreInlineCacheStart(this,0);
  SetIsInstInlineCacheCount(this,0);
  local_18 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<void_*>::operator=(&this->inlineCaches,&local_18);
  InlineCachePointerArray<Js::PolymorphicInlineCache>::Reset(&this->polymorphicInlineCaches);
  return;
}

Assistant:

void FunctionBody::ResetInlineCaches()
    {
        SetInlineCacheCount(0);
        SetRootObjectLoadInlineCacheStart(0);
        SetRootObjectStoreInlineCacheStart(0);
        SetIsInstInlineCacheCount(0);
        this->inlineCaches = nullptr;
        this->polymorphicInlineCaches.Reset();
    }